

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O0

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::extract_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,size_t root_id)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  Index *pIVar4;
  size_type sVar5;
  unsigned_long local_178;
  uint local_16c;
  size_type local_168;
  uint local_15c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_150;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_140;
  reference local_138;
  value_type *dst_node;
  value_type *src_node;
  type_conflict *dst_id;
  type_conflict *src_id;
  unsigned_long uStack_110;
  int local_104;
  undefined1 local_100 [8];
  stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  stack;
  size_t local_98;
  size_t root_id_local;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this_local;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh;
  Index *local_78;
  Index *local_70;
  Index *local_68;
  Index *local_60;
  Index *local_58;
  Index *local_50;
  Index<32UL,_4UL> local_44;
  size_type local_40;
  Index *local_38;
  Index *local_30;
  Index<32UL,_4UL> local_24;
  size_type local_20;
  Index *local_18;
  Index *local_10;
  
  local_98 = root_id;
  root_id_local = (size_t)this;
  this_local = __return_storage_ptr__;
  if (root_id != 0) {
    Bvh(__return_storage_ptr__);
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::emplace_back<>(&__return_storage_ptr__->nodes);
    std::
    stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    stack<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              ((stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                *)local_100);
    local_104 = 0;
    std::
    stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::emplace<unsigned_long&,int>
              ((stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                *)local_100,&local_98,&local_104);
    while (bVar2 = std::
                   stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                   ::empty((stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)local_100), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::top((stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)local_100);
      src_id = (type_conflict *)pvVar3->first;
      uStack_110 = pvVar3->second;
      dst_id = std::get<0ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)&src_id);
      src_node = (value_type *)
                 std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)&src_id);
      std::
      stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::pop((stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)local_100);
      dst_node = std::
                 vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ::operator[](&this->nodes,*dst_id);
      local_138 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&__return_storage_ptr__->nodes,
                               *(size_type *)(src_node->bounds)._M_elems);
      *(undefined8 *)(local_138->bounds)._M_elems = *(undefined8 *)(dst_node->bounds)._M_elems;
      *(undefined8 *)((local_138->bounds)._M_elems + 2) =
           *(undefined8 *)((dst_node->bounds)._M_elems + 2);
      *(undefined8 *)((local_138->bounds)._M_elems + 4) =
           *(undefined8 *)((dst_node->bounds)._M_elems + 4);
      (local_138->index).value = (dst_node->index).value;
      bvh = (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)dst_node;
      local_60 = &dst_node->index;
      local_58 = local_60;
      if ((local_60->value & 0xf) == 0) {
        pIVar4 = &local_138->index;
        local_40 = std::
                   vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ::size(&__return_storage_ptr__->nodes);
        local_38 = pIVar4;
        local_30 = pIVar4;
        Index<32UL,_4UL>::Index(&local_44,local_40,(ulong)(pIVar4->value & 0xf));
        pIVar4->value = local_44.value;
        local_70 = &dst_node->index;
        local_15c = local_70->value >> 4;
        local_168 = std::
                    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ::size(&__return_storage_ptr__->nodes);
        std::
        stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
        ::emplace<unsigned_int,unsigned_long>
                  ((stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                    *)local_100,&local_15c,&local_168);
        local_78 = &dst_node->index;
        local_16c = (local_78->value >> 4) + 1;
        sVar5 = std::
                vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ::size(&__return_storage_ptr__->nodes);
        local_178 = sVar5 + 1;
        std::
        stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
        ::emplace<unsigned_int,unsigned_long>
                  ((stack<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
                    *)local_100,&local_16c,&local_178);
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::emplace_back<>(&__return_storage_ptr__->nodes);
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::emplace_back<>(&__return_storage_ptr__->nodes);
      }
      else {
        pIVar4 = &local_138->index;
        local_20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (&__return_storage_ptr__->prim_ids);
        local_18 = pIVar4;
        local_10 = pIVar4;
        Index<32UL,_4UL>::Index(&local_24,local_20,(ulong)(pIVar4->value & 0xf));
        pIVar4->value = local_24.value;
        local_148._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->prim_ids);
        local_68 = &dst_node->index;
        local_140 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_148,(ulong)(local_68->value >> 4));
        local_50 = &dst_node->index;
        uVar1 = local_50->value;
        local_150 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    std::back_inserter<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                              (&__return_storage_ptr__->prim_ids);
        local_158 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    std::
                    copy_n<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_int,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              (local_140,uVar1 & 0xf,
                               (back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )local_150);
      }
    }
    std::
    stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~stack((stack<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)local_100);
    return __return_storage_ptr__;
  }
  __assert_fail("root_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/bvh.h"
                ,0x5d,
                "Bvh<Node> bvh::v2::Bvh<bvh::v2::Node<float, 3>>::extract_bvh(size_t) const [Node = bvh::v2::Node<float, 3>]"
               );
}

Assistant:

Bvh<Node> Bvh<Node>::extract_bvh(size_t root_id) const {
    assert(root_id != 0);

    Bvh bvh;
    bvh.nodes.emplace_back();

    std::stack<std::pair<size_t, size_t>> stack;
    stack.emplace(root_id, 0);
    while (!stack.empty()) {
        auto [src_id, dst_id] = stack.top();
        stack.pop();
        const auto& src_node = nodes[src_id];
        auto& dst_node = bvh.nodes[dst_id];
        dst_node = src_node;
        if (src_node.is_leaf()) {
            dst_node.index.set_first_id(bvh.prim_ids.size());
            std::copy_n(
                prim_ids.begin() + src_node.index.first_id(),
                src_node.index.prim_count(),
                std::back_inserter(bvh.prim_ids));
        } else {
            dst_node.index.set_first_id(bvh.nodes.size());
            stack.emplace(src_node.index.first_id() + 0, bvh.nodes.size() + 0);
            stack.emplace(src_node.index.first_id() + 1, bvh.nodes.size() + 1);
            // Note: This may invalidate `dst_node` so has to happen after any access to it.
            bvh.nodes.emplace_back();
            bvh.nodes.emplace_back();
        }
    }
    return bvh;
}